

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O3

Error __thiscall asmjit::_abi_1_10::a64::EmitHelper::emitProlog(EmitHelper *this,FuncFrame *frame)

{
  uint8_t uVar1;
  uint16_t uVar2;
  BaseEmitter *this_00;
  RegGroup RVar3;
  Error EVar4;
  GroupData *pGVar5;
  Reg *pRVar6;
  LoadStoreInstructions *pLVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  RegGroup group;
  Operand_ local_118;
  uint32_t hi;
  uint32_t local_f8;
  uint32_t local_f4;
  FuncFrame *local_f0;
  Reg regs [2];
  PrologEpilogInfo pei;
  
  this_00 = (this->super_BaseEmitHelper)._emitter;
  EVar4 = PrologEpilogInfo::init(&pei,(EVP_PKEY_CTX *)frame);
  if (EVar4 != 0) {
    return EVar4;
  }
  local_f4 = pei.sizeTotal;
  local_f8 = -pei.sizeTotal;
  hi = (int)local_f8 >> 0x1f;
  RVar3 = k0;
  local_f0 = frame;
  while( true ) {
    if (RVar3 == kExtraVirt2) break;
    group = RVar3;
    pGVar5 = Support::Array<asmjit::_abi_1_10::a64::PrologEpilogInfo::GroupData,_2UL>::
             operator[]<asmjit::_abi_1_10::RegGroup>(&pei.groups,&group);
    uVar9 = pGVar5->pairCount;
    pRVar6 = Support::Array<asmjit::_abi_1_10::arm::Reg,_2UL>::
             operator[]<asmjit::_abi_1_10::RegGroup>(&emitProlog::groupRegs,&group);
    regs[0].super_BaseReg.super_Operand.super_Operand_._signature._bits =
         (pRVar6->super_BaseReg).super_Operand.super_Operand_._signature._bits;
    regs[0].super_BaseReg.super_Operand.super_Operand_._baseId =
         (pRVar6->super_BaseReg).super_Operand.super_Operand_._baseId;
    regs[0].super_BaseReg.super_Operand.super_Operand_._data =
         *&(pRVar6->super_BaseReg).super_Operand.super_Operand_._data;
    pRVar6 = Support::Array<asmjit::_abi_1_10::arm::Reg,_2UL>::
             operator[]<asmjit::_abi_1_10::RegGroup>(&emitProlog::groupRegs,&group);
    regs[1].super_BaseReg.super_Operand.super_Operand_._signature._bits =
         (pRVar6->super_BaseReg).super_Operand.super_Operand_._signature._bits;
    regs[1].super_BaseReg.super_Operand.super_Operand_._baseId =
         (pRVar6->super_BaseReg).super_Operand.super_Operand_._baseId;
    regs[1].super_BaseReg.super_Operand.super_Operand_._data =
         *&(pRVar6->super_BaseReg).super_Operand.super_Operand_._data;
    local_118._signature._bits = 0x3a;
    local_118._baseId = 0x1f;
    local_118._data[0] = 0;
    local_118._data[1] = 0;
    pLVar7 = Support::Array<asmjit::_abi_1_10::a64::LoadStoreInstructions,_2UL>::
             operator[]<asmjit::_abi_1_10::RegGroup>(&emitProlog::groupInsts,&group);
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      regs[0].super_BaseReg.super_Operand.super_Operand_._baseId._0_1_ =
           pGVar5->pairs[uVar10].ids[0];
      regs[0].super_BaseReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
      uVar1 = pGVar5->pairs[uVar10].ids[1];
      regs[1].super_BaseReg.super_Operand.super_Operand_._baseId._0_1_ = uVar1;
      regs[1].super_BaseReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
      uVar2 = pGVar5->pairs[uVar10].offset;
      local_118._data[1]._0_2_ = uVar2;
      local_118._data[1]._2_2_ = 0;
      if (uVar2 == 0 && local_f4 != 0) {
        local_118._data[1] = local_f8;
        uVar8 = hi;
        if ((local_118._0_8_ & 0xf8) != 0) {
          uVar8 = local_118._baseId;
        }
        local_118._0_8_ = CONCAT44(uVar8,local_118._signature._bits) & 0xffffffffff0fffff | 0xe00000
        ;
      }
      if (uVar1 == 0xff) {
        EVar4 = BaseEmitter::_emitI(this_00,pLVar7->singleInstId,(Operand_ *)regs,&local_118);
      }
      else {
        EVar4 = BaseEmitter::_emitI(this_00,pLVar7->pairInstId,(Operand_ *)regs,
                                    (Operand_ *)(regs + 1),&local_118);
      }
      if (EVar4 != 0) {
        return EVar4;
      }
      local_118._0_8_ = local_118._0_8_ & 0xffffffffff0fffff;
      if (((uVar10 == 0) && ((local_f0->_attributes & kHasPreservedFP) != kNoAttributes)) &&
         (EVar4 = EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter>::mov
                            ((EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter> *)this_00,
                             (Gp *)a64::regs::x29,(Gp *)a64::regs::sp), EVar4 != 0)) {
        return EVar4;
      }
    }
    RVar3 = RVar3 + kVec;
  }
  uVar9 = local_f0->_stackAdjustment;
  if (uVar9 == 0) {
    return 0;
  }
  if (0xfff < uVar9) {
    if (0xffffff < uVar9) {
      return 3;
    }
    regs[0].super_BaseReg.super_Operand.super_Operand_._signature._bits = 3;
    regs[0].super_BaseReg.super_Operand.super_Operand_._baseId = 0;
    regs[0].super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
    regs[0].super_BaseReg.super_Operand.super_Operand_._data[0] = uVar9 & 0xfff;
    EVar4 = EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter>::sub
                      ((EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter> *)this_00,
                       (Gp *)a64::regs::sp,(Gp *)a64::regs::sp,(Imm *)regs);
    if (EVar4 != 0) {
      return EVar4;
    }
    uVar9 = uVar9 & 0xfff000;
  }
  regs[0].super_BaseReg.super_Operand.super_Operand_._signature._bits = 3;
  regs[0].super_BaseReg.super_Operand.super_Operand_._baseId = 0;
  regs[0].super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
  regs[0].super_BaseReg.super_Operand.super_Operand_._data[0] = uVar9;
  EVar4 = EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter>::sub
                    ((EmitterExplicitT<asmjit::_abi_1_10::a64::Emitter> *)this_00,
                     (Gp *)a64::regs::sp,(Gp *)a64::regs::sp,(Imm *)regs);
  if (EVar4 != 0) {
    return EVar4;
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitProlog(const FuncFrame& frame) {
  Emitter* emitter = _emitter->as<Emitter>();

  PrologEpilogInfo pei;
  ASMJIT_PROPAGATE(pei.init(frame));

  static const Support::Array<Reg, 2> groupRegs = {{ x0, d0 }};
  static const Support::Array<LoadStoreInstructions, 2> groupInsts = {{
    { Inst::kIdStr  , Inst::kIdStp   },
    { Inst::kIdStr_v, Inst::kIdStp_v }
  }};

  uint32_t adjustInitialOffset = pei.sizeTotal;

  for (RegGroup group : Support::EnumValues<RegGroup, RegGroup::kGp, RegGroup::kVec>{}) {
    const PrologEpilogInfo::GroupData& data = pei.groups[group];
    uint32_t pairCount = data.pairCount;

    Reg regs[2] = { groupRegs[group], groupRegs[group] };
    Mem mem = ptr(sp);

    const LoadStoreInstructions& insts = groupInsts[group];
    for (uint32_t i = 0; i < pairCount; i++) {
      const PrologEpilogInfo::RegPair& pair = data.pairs[i];

      regs[0].setId(pair.ids[0]);
      regs[1].setId(pair.ids[1]);
      mem.setOffsetLo32(pair.offset);

      if (pair.offset == 0 && adjustInitialOffset) {
        mem.setOffset(-int(adjustInitialOffset));
        mem.makePreIndex();
      }

      if (pair.ids[1] == BaseReg::kIdBad)
        ASMJIT_PROPAGATE(emitter->emit(insts.singleInstId, regs[0], mem));
      else
        ASMJIT_PROPAGATE(emitter->emit(insts.pairInstId, regs[0], regs[1], mem));

      mem.resetToFixedOffset();

      if (i == 0 && frame.hasPreservedFP()) {
        ASMJIT_PROPAGATE(emitter->mov(x29, sp));
      }
    }
  }

  if (frame.hasStackAdjustment()) {
    uint32_t adj = frame.stackAdjustment();
    if (adj <= 0xFFFu) {
      ASMJIT_PROPAGATE(emitter->sub(sp, sp, adj));
    }
    else if (adj <= 0xFFFFFFu)  {
      // TODO: [ARM] Prolog - we must touch the pages otherwise it's undefined.
      ASMJIT_PROPAGATE(emitter->sub(sp, sp, adj & 0x000FFFu));
      ASMJIT_PROPAGATE(emitter->sub(sp, sp, adj & 0xFFF000u));
    }
    else {
      return DebugUtils::errored(kErrorInvalidState);
    }
  }

  return kErrorOk;
}